

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logistic_dist.hpp
# Opt level: O2

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,param_type *P)

{
  undefined4 uVar1;
  long lVar2;
  basic_istream<char,_std::char_traits<char>_> *pbVar3;
  istream *piVar4;
  long lVar5;
  double eta;
  double theta;
  delim_c local_2b;
  delim_c local_2a;
  delim_c local_29;
  result_type_conflict2 local_28;
  result_type_conflict2 local_20;
  
  uVar1 = *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = 0x26;
  local_29.c = '(';
  pbVar3 = utility::operator>>(in,&local_29);
  piVar4 = std::istream::_M_extract<double>((double *)pbVar3);
  local_2a.c = ' ';
  pbVar3 = utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)piVar4,&local_2a);
  piVar4 = std::istream::_M_extract<double>((double *)pbVar3);
  local_2b.c = ')';
  utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)piVar4,&local_2b);
  lVar2 = *(long *)in;
  lVar5 = *(long *)(lVar2 + -0x18);
  if (((byte)in[lVar5 + 0x20] & 5) == 0) {
    P->theta_ = local_20;
    P->eta_ = local_28;
    lVar5 = *(long *)(lVar2 + -0x18);
  }
  *(undefined4 *)(in + lVar5 + 0x18) = uVar1;
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
          std::basic_istream<char_t, traits_t> &in, param_type &P) {
        float_t theta, eta;
        std::ios_base::fmtflags flags(in.flags());
        in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        in >> utility::delim('(') >> theta >> utility::delim(' ') >> eta >> utility::delim(')');
        if (in)
          P = param_type(theta, eta);
        in.flags(flags);
        return in;
      }